

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.h
# Opt level: O0

Polynom<Finite> __thiscall Polynom<Finite>::operator-(Polynom<Finite> *this,Polynom<Finite> *a)

{
  Polynom<Finite> *this_00;
  Finite *extraout_RDX;
  undefined8 in_RDI;
  Polynom<Finite> PVar1;
  Polynom<Finite> temp;
  Polynom<Finite> *in_stack_ffffffffffffff98;
  Polynom<Finite> *in_stack_ffffffffffffffa0;
  Polynom<Finite> *in_stack_ffffffffffffffc8;
  Polynom<Finite> *in_stack_ffffffffffffffd0;
  
  Polynom(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  operator-(in_stack_ffffffffffffffc8);
  this_00 = operator+=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  Polynom(this_00,in_stack_ffffffffffffff98);
  ~Polynom((Polynom<Finite> *)0x11bdd1);
  ~Polynom((Polynom<Finite> *)0x11bddb);
  PVar1.m.arr = extraout_RDX;
  PVar1.m._0_8_ = in_RDI;
  return (Polynom<Finite>)PVar1.m;
}

Assistant:

inline const Polynom operator-(const Polynom &a) const
    {
        Polynom temp(*this);
        return temp += -a;
    }